

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O0

int mp_fprint_ext_default(FILE *file,char **data,int depth)

{
  int iVar1;
  uint local_24;
  char local_1d;
  uint32_t len;
  int8_t type;
  char **ppcStack_18;
  int depth_local;
  char **data_local;
  FILE *file_local;
  
  len = depth;
  ppcStack_18 = data;
  data_local = (char **)file;
  mp_decode_ext(data,&local_1d,&local_24);
  iVar1 = fprintf((FILE *)data_local,"(extension: type %d, len %u)",(ulong)(uint)(int)local_1d,
                  (ulong)local_24);
  return iVar1;
}

Assistant:

int
mp_fprint_ext_default(FILE *file, const char **data, int depth)
{
	(void) depth;
	int8_t type;
	uint32_t len;
	mp_decode_ext(data, &type, &len);
	return fprintf(file, "(extension: type %d, len %u)", (int)type,
		      (unsigned)len);
}